

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O1

int gethtmltagdata(char *str,char *tag,char **pTagParams,char **pTagData)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *__dest;
  char *pcVar7;
  char *pcVar8;
  char *__dest_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  int count;
  char *ptr;
  uint local_5c;
  char *local_58;
  char *local_50;
  char *local_48;
  char **local_40;
  char **local_38;
  
  local_48 = (char *)0x0;
  local_5c = 0;
  sVar6 = strlen(tag);
  __dest = (char *)calloc(sVar6 + 2,1);
  if (__dest == (char *)0x0) {
    iVar9 = 6;
  }
  else {
    *__dest = '<';
    strcat(__dest,tag);
    pcVar7 = stristrbeginend(str,__dest,">",&local_48,(int *)&local_5c);
    if (pcVar7 == (char *)0x0) {
      iVar9 = 4;
    }
    else {
      sVar6 = (size_t)(int)local_5c;
      pcVar8 = (char *)calloc(sVar6 + 1,1);
      pcVar7 = local_48;
      *pTagParams = pcVar8;
      if (pcVar8 == (char *)0x0) {
        iVar9 = 6;
      }
      else {
        local_50 = pcVar8;
        local_40 = pTagParams;
        local_38 = pTagData;
        memcpy(pcVar8,local_48,sVar6);
        sVar6 = strlen(tag);
        __dest_00 = (char *)calloc(sVar6 + 4,1);
        iVar9 = 6;
        pcVar8 = local_50;
        if (__dest_00 != (char *)0x0) {
          __dest_00[0] = '<';
          __dest_00[1] = '/';
          strcat(__dest_00,tag);
          sVar6 = strlen(__dest_00);
          (__dest_00 + sVar6)[0] = '>';
          (__dest_00 + sVar6)[1] = '\0';
          if (*str == '\0') {
LAB_001673b2:
            pcVar8 = (char *)0x0;
          }
          else {
            local_58 = pcVar7;
            while( true ) {
              pcVar8 = (char *)0x0;
              cVar2 = *str;
              pcVar7 = local_58;
              if (cVar2 == 0) break;
              iVar4 = toupper((int)*__dest_00);
              iVar5 = toupper((int)cVar2);
              if (iVar5 == iVar4) {
                bVar12 = false;
                pcVar8 = str;
              }
              else {
                do {
                  pcVar8 = str + 1;
                  bVar12 = *pcVar8 == '\0';
                  pcVar7 = local_58;
                  if (bVar12) goto LAB_001673b2;
                  str = str + 1;
                  iVar5 = toupper((int)*pcVar8);
                  pcVar8 = str;
                } while (iVar5 != iVar4);
              }
              pcVar7 = local_58;
              if (bVar12) goto LAB_001673b2;
              lVar11 = 0;
              while( true ) {
                iVar4 = toupper((int)pcVar8[lVar11]);
                iVar5 = toupper((int)__dest_00[lVar11]);
                pcVar7 = local_58;
                if (iVar4 != iVar5) break;
                lVar3 = lVar11 + 1;
                lVar11 = lVar11 + 1;
                if (__dest_00[lVar3] == '\0') goto LAB_001673b4;
              }
              pcVar1 = pcVar8 + 1;
              str = pcVar8 + 1;
              pcVar8 = (char *)0x0;
              if (*pcVar1 == '\0') break;
            }
          }
LAB_001673b4:
          if ((pcVar8 == (char *)0x0) ||
             (uVar10 = (int)pcVar8 - (int)pcVar7, local_5c = uVar10, (int)uVar10 < 0)) {
            free(__dest_00);
            iVar9 = 4;
            pcVar8 = local_50;
          }
          else {
            pcVar7 = (char *)calloc((ulong)(uVar10 + 1),1);
            *local_38 = pcVar7;
            if (pcVar7 == (char *)0x0) {
              free(__dest_00);
              pcVar8 = *local_40;
            }
            else {
              memcpy(pcVar7,pcVar8,(ulong)(uVar10 & 0x7fffffff));
              iVar9 = 0;
              pcVar8 = __dest_00;
            }
          }
        }
        free(pcVar8);
      }
    }
    free(__dest);
  }
  return iVar9;
}

Assistant:

inline int gethtmltagdata(char* str, char* tag, char** pTagParams, char** pTagData)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	char* tagbegin = NULL;
	char* tagend = NULL;

	tagbegin = (char*)calloc(strlen(tag)+2, 1);
	if (tagbegin == NULL)
	{
		return EXIT_OUT_OF_MEMORY;
	}

	tagbegin[0] = '<';
	strcat(tagbegin, tag);

	if (stristrbeginend(str, tagbegin, ">", &ptr, &count) == NULL)
	{
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagParams = (char*)calloc(count+1, 1);
	if (*pTagParams == NULL)
	{
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagParams, ptr, count);

	tagend = (char*)calloc(strlen(tag)+4, 1);
	if (tagend == NULL)
	{
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}

	tagend[0] = '<';
	tagend[1] = '/';
	strcat(tagend, tag);
	strcat(tagend, ">");

	ptr2 = stristr(str, tagend);
	if (ptr2 == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	count = (int)(ptr2-ptr);
	if (count < 0)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagData = (char*)calloc(count+1, 1);
	if (*pTagData == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagData, ptr2, count);

	free(tagend);
	free(tagbegin);

	return EXIT_SUCCESS;
}